

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall
duckdb::CollectionScanState::Initialize
          (CollectionScanState *this,vector<duckdb::LogicalType,_true> *types)

{
  vector<duckdb::StorageIndex,_true> *this_00;
  TableScanState *pTVar1;
  pointer pSVar2;
  pointer pSVar3;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  const_reference pvVar9;
  const_reference type;
  long lVar10;
  pointer __p;
  size_type __n;
  ulong uVar11;
  ColumnScanState *local_40;
  vector<duckdb::LogicalType,_true> *local_38;
  
  pTVar1 = this->parent;
  pSVar2 = (pTVar1->column_ids).
           super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
           super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar3 = (pTVar1->column_ids).
           super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
           super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (long)pSVar2 - (long)pSVar3 >> 5;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar11;
  uVar6 = SUB168(auVar5 * ZEXT816(0x98),0);
  uVar7 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar7 = 0xffffffffffffffff;
  }
  uVar6 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x98),8) == 0) {
    uVar6 = uVar7;
  }
  local_38 = types;
  puVar8 = (ulong *)operator_new__(uVar6);
  *puVar8 = uVar11;
  if (pSVar2 != pSVar3) {
    switchD_01306cb1::default
              ((ColumnScanState *)(puVar8 + 1),0,((uVar11 * 0x98 - 0x98) / 0x98) * 0x98 + 0x98);
  }
  local_40 = (ColumnScanState *)0x0;
  _Var4._M_head_impl =
       (this->column_scans).
       super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
       .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
  (this->column_scans).
  super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
  .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl =
       (ColumnScanState *)(puVar8 + 1);
  if (_Var4._M_head_impl != (ColumnScanState *)0x0) {
    ::std::default_delete<duckdb::ColumnScanState[]>::operator()
              ((default_delete<duckdb::ColumnScanState[]> *)&this->column_scans,_Var4._M_head_impl);
  }
  if (local_40 != (ColumnScanState *)0x0) {
    ::std::default_delete<duckdb::ColumnScanState[]>::operator()
              ((default_delete<duckdb::ColumnScanState[]> *)&local_40,local_40);
  }
  if ((pTVar1->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
      .super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pTVar1->column_ids).super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
      .super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &pTVar1->column_ids;
    lVar10 = 0;
    __n = 0;
    do {
      pvVar9 = vector<duckdb::StorageIndex,_true>::operator[](this_00,__n);
      if (pvVar9->index != 0xffffffffffffffff) {
        pvVar9 = vector<duckdb::StorageIndex,_true>::operator[](this_00,__n);
        _Var4._M_head_impl =
             (this->column_scans).
             super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
             .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
        type = vector<duckdb::LogicalType,_true>::operator[](local_38,pvVar9->index);
        pvVar9 = vector<duckdb::StorageIndex,_true>::operator[](this_00,__n);
        ColumnScanState::Initialize
                  ((ColumnScanState *)((long)&(_Var4._M_head_impl)->current + lVar10),type,
                   &pvVar9->child_indexes,
                   (optional_ptr<duckdb::TableScanOptions,_true>)&this->parent->options);
      }
      __n = __n + 1;
      lVar10 = lVar10 + 0x98;
    } while (__n < (ulong)((long)(pTVar1->column_ids).
                                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 .
                                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->column_ids).
                                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 .
                                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return;
}

Assistant:

void CollectionScanState::Initialize(const vector<LogicalType> &types) {
	auto &column_ids = GetColumnIds();
	column_scans = make_unsafe_uniq_array<ColumnScanState>(column_ids.size());
	for (idx_t i = 0; i < column_ids.size(); i++) {
		if (column_ids[i].IsRowIdColumn()) {
			continue;
		}
		auto col_id = column_ids[i].GetPrimaryIndex();
		column_scans[i].Initialize(types[col_id], column_ids[i].GetChildIndexes(), &GetOptions());
	}
}